

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void fixed_api_suite::api_insert_value(void)

{
  pair<int,_int> *local_98;
  undefined4 local_8c;
  size_type local_88 [2];
  iterator local_78;
  int local_70 [2];
  value_type local_68;
  iterator local_60;
  undefined4 local_54;
  size_type local_50 [2];
  undefined1 local_40 [8];
  map_view<int,_int,_4UL,_std::less<int>_> span;
  pair<int,_int> array [4];
  
  local_98 = (pair<int,_int> *)&span.member;
  do {
    memset(local_98,0,8);
    vista::pair<int,_int>::pair(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != array + 3);
  vista::map_view<int,_int,_4UL,_std::less<int>_>::map_view<4UL,_0>
            ((map_view<int,_int,_4UL,_std::less<int>_> *)local_40,(value_type (*) [4])&span.member);
  local_50[0] = vista::map_view<int,_int,_4UL,_std::less<int>_>::size
                          ((map_view<int,_int,_4UL,_std::less<int>_> *)local_40);
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfa,"void fixed_api_suite::api_insert_value()",local_50,&local_54);
  local_70[1] = 0xb;
  local_70[0] = 1;
  vista::pair<int,_int>::pair<int,_int,_0>(&local_68,local_70 + 1,local_70);
  local_60 = vista::map_view<int,_int,_4UL,_std::less<int>_>::insert
                       ((map_view<int,_int,_4UL,_std::less<int>_> *)local_40,local_68);
  local_78 = vista::span<vista::pair<int,_int>,_4UL>::begin
                       ((span<vista::pair<int,_int>,_4UL> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.insert({ 11, 1 })","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfb,"void fixed_api_suite::api_insert_value()",&local_60,&local_78);
  local_88[0] = vista::map_view<int,_int,_4UL,_std::less<int>_>::size
                          ((map_view<int,_int,_4UL,_std::less<int>_> *)local_40);
  local_8c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfc,"void fixed_api_suite::api_insert_value()",local_88,&local_8c);
  return;
}

Assistant:

void api_insert_value()
{
    pair<int, int> array[4] = {};
    map_view<int, int, 4> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.insert({ 11, 1 }), span.begin());
    BOOST_TEST_EQ(span.size(), 1);
}